

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

void __thiscall
wabt::interp::HostFunc::HostFunc(HostFunc *this,Store *param_1,FuncType *type,Callback *callback)

{
  FuncType local_68;
  Callback *local_28;
  Callback *callback_local;
  FuncType *type_local;
  Store *param_1_local;
  HostFunc *this_local;
  
  local_28 = callback;
  callback_local = (Callback *)type;
  type_local = (FuncType *)param_1;
  param_1_local = (Store *)this;
  FuncType::FuncType(&local_68,type);
  Func::Func(&this->super_Func,HostFunc,&local_68);
  FuncType::~FuncType(&local_68);
  (this->super_Func).super_Extern.super_Object._vptr_Object = (_func_int **)&PTR__HostFunc_004b2878;
  std::
  function<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*)>
  ::function(&this->callback_,callback);
  return;
}

Assistant:

HostFunc::HostFunc(Store&, FuncType type, Callback callback)
    : Func(skind, type), callback_(callback) {}